

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

char * glfwGetJoystickName(int jid)

{
  ulong uVar1;
  GLFWbool GVar2;
  int iVar3;
  char *pcVar4;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/src/input.c",
                  0x436,"const char *glfwGetJoystickName(int)");
  }
  uVar1 = (ulong)(uint)jid;
  if (0xf < (uint)jid) {
    __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/src/input.c",
                  0x437,"const char *glfwGetJoystickName(int)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    pcVar4 = (char *)0x0;
  }
  else {
    GVar2 = initJoysticks();
    if ((GVar2 == 0) || (_glfw.joysticks[uVar1].present == 0)) {
      pcVar4 = (char *)0x0;
    }
    else {
      iVar3 = (*_glfw.platform.pollJoystick)((_GLFWjoystick *)(uVar1 * 0x2018 + 0x14cdc8),0);
      pcVar4 = (char *)0x0;
      if (iVar3 != 0) {
        pcVar4 = _glfw.joysticks[uVar1].name;
      }
    }
  }
  return pcVar4;
}

Assistant:

GLFWAPI const char* glfwGetJoystickName(int jid)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return NULL;
    }

    if (!initJoysticks())
        return NULL;

    js = _glfw.joysticks + jid;
    if (!js->present)
        return NULL;

    if (!_glfw.platform.pollJoystick(js, _GLFW_POLL_PRESENCE))
        return NULL;

    return js->name;
}